

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocess.h
# Opt level: O1

VarOrConst __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
::Convert(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
          *this)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined8 in_RAX;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  anon_union_8_2_43b0091d_for_VarOrConst_1 aVar5;
  NodeRange NVar6;
  VarOrConst VVar7;
  
  dVar2 = (this->prepro_).lb_;
  pdVar1 = &(this->prepro_).ub_;
  if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar2;
    return (VarOrConst)(auVar3 << 0x40);
  }
  aVar5 = (anon_union_8_2_43b0091d_for_VarOrConst_1)(long)(this->prepro_).result_var_;
  if ((long)aVar5 < 0) {
    bVar4 = MapFind(this);
    in_RAX = CONCAT71(extraout_var,bVar4);
    if (!bVar4) {
      NVar6 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AddVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)this->converter_,(this->prepro_).lb_,(this->prepro_).ub_,
                       (this->prepro_).type_);
      (this->prepro_).result_var_ = NVar6.ir_.beg_;
      (this->constr_).super_FunctionalConstraint.result_var_ = NVar6.ir_.beg_;
      AddConstraint(this);
      in_RAX = extraout_RAX;
    }
    aVar5._4_4_ = 0;
    aVar5.var_ = (this->prepro_).result_var_;
  }
  VVar7._1_7_ = (undefined7)((ulong)in_RAX >> 8);
  VVar7.is_v_ = true;
  VVar7.field_1.c_ = aVar5.c_;
  return VVar7;
}

Assistant:

bool is_constant() const { return lb_==ub_; }